

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_id.c
# Opt level: O0

void csp_id2_prepend(csp_packet_t *packet)

{
  undefined4 *puVar1;
  __uint64_t _Var2;
  long in_RDI;
  uint64_t id2;
  undefined4 local_10;
  undefined2 uStack_c;
  
  _Var2 = __bswap_64(((ulong)*(byte *)(in_RDI + 0x2c) << 0x2e |
                      (ulong)*(ushort *)(in_RDI + 0x30) << 0x20 |
                      (ulong)*(ushort *)(in_RDI + 0x2e) << 0x12 |
                      (long)(int)((uint)*(byte *)(in_RDI + 0x32) << 0xc) |
                      (long)(int)((uint)*(byte *)(in_RDI + 0x33) << 6) |
                     (long)(int)(uint)*(byte *)(in_RDI + 0x2d)) << 0x10);
  *(long *)(in_RDI + 0x20) = in_RDI + 0x42;
  *(short *)(in_RDI + 0x28) = *(short *)(in_RDI + 0x2a) + 6;
  puVar1 = *(undefined4 **)(in_RDI + 0x20);
  local_10 = (undefined4)_Var2;
  *puVar1 = local_10;
  uStack_c = (undefined2)(_Var2 >> 0x20);
  *(undefined2 *)(puVar1 + 1) = uStack_c;
  return;
}

Assistant:

static void csp_id2_prepend(csp_packet_t * packet) {

	/* Pack into 64-bit using host endian */
	uint64_t id2 = ((((uint64_t)packet->id.pri) << CSP_ID2_PRIO_OFFSET) |
					(((uint64_t)packet->id.dst) << CSP_ID2_DST_OFFSET) |
					(((uint64_t)packet->id.src) << CSP_ID2_SRC_OFFSET) |
					(packet->id.dport << CSP_ID2_DPORT_OFFSET) |
					(packet->id.sport << CSP_ID2_SPORT_OFFSET) |
					(packet->id.flags << CSP_ID2_FLAGS_OFFSET));

	/* Convert to big / network endian:
	 * We first shift up the 48 bit header to most significant end of the 64-bit */
	id2 = htobe64(id2 << 16);

	packet->frame_begin = packet->data - CSP_ID2_HEADER_SIZE;
	packet->frame_length = packet->length + CSP_ID2_HEADER_SIZE;

	memcpy(packet->frame_begin, &id2, CSP_ID2_HEADER_SIZE);
}